

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sequence_kernel_2.h
# Opt level: O2

void __thiscall
dlib::sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>::
move_to_pos(sequence_kernel_2<dlib::document_handler_*,_dlib::memory_manager_stateless_kernel_1<char>_>
            *this,node **current_node,unsigned_long *current_pos,unsigned_long pos,
           unsigned_long size)

{
  ulong uVar1;
  node *pnVar2;
  long lVar3;
  ulong uVar4;
  bool bVar5;
  
  uVar1 = *current_pos;
  lVar3 = uVar1 - pos;
  if (uVar1 < pos || lVar3 == 0) {
    if (lVar3 != 0) {
      uVar4 = (size - pos) + uVar1;
      *current_pos = pos;
      pnVar2 = *current_node;
      if (uVar4 < pos - uVar1) {
        while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
          pnVar2 = pnVar2->left;
          *current_node = pnVar2;
        }
      }
      else {
        for (; lVar3 != 0; lVar3 = lVar3 + 1) {
          pnVar2 = pnVar2->right;
          *current_node = pnVar2;
        }
      }
    }
  }
  else {
    uVar4 = (size + pos) - uVar1;
    *current_pos = pos;
    pnVar2 = *current_node;
    if (uVar1 - pos < uVar4) {
      for (lVar3 = pos - uVar1; lVar3 != 0; lVar3 = lVar3 + 1) {
        pnVar2 = pnVar2->left;
        *current_node = pnVar2;
      }
    }
    else {
      while (bVar5 = uVar4 != 0, uVar4 = uVar4 - 1, bVar5) {
        pnVar2 = pnVar2->right;
        *current_node = pnVar2;
      }
    }
  }
  return;
}

Assistant:

void sequence_kernel_2<T,mem_manager>::
    move_to_pos (
        node*& current_node,
        unsigned long& current_pos,
        unsigned long pos,
        unsigned long size
    ) const
    {
        if ( current_pos > pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = size + pos - current_pos;
            unsigned long left = current_pos - pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
        else if (current_pos != pos)
        {
            // number of hops in each direction needed to reach pos
            unsigned long right = pos - current_pos;
            unsigned long left = size - pos + current_pos;
            current_pos = pos;

            if (left < right)
            {
                // move left to position pos
                for (; left > 0; --left)
                    current_node = current_node->left;
            }
            else
            {
                // move left to position pos
                for (; right > 0; --right)
                    current_node = current_node->right;
            }
        }
    }